

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_header_parentedentity.cpp
# Opt level: O0

void __thiscall APIHeader_parentedentity_Test::TestBody(APIHeader_parentedentity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult local_68 [2];
  AssertHelper local_48 [8];
  Message local_40 [31];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  APIHeader_parentedentity_Test *this_local;
  
  local_21 = true;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_68,local_20,"size_t(4) == size_t(4)","false");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/build_O0/tests/api_headers/api_header_parentedentity.cpp"
               ,0x1b,pcVar2);
    testing::internal::AssertHelper::operator=(local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    std::__cxx11::string::~string((string *)local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(APIHeader, parentedentity)
{
    EXPECT_TRUE(size_t(4) == size_t(4));
}